

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidx_manager.c
# Opt level: O0

void write_cptr(int coff,int clen,opj_cio_t *cio)

{
  int pos;
  int iVar1;
  opj_cio_t *in_RDX;
  undefined4 in_ESI;
  undefined4 in_EDI;
  int lenp;
  int len;
  int in_stack_ffffffffffffffec;
  
  pos = cio_tell(in_RDX);
  cio_skip(in_RDX,4);
  cio_write((opj_cio_t *)CONCAT44(in_EDI,in_ESI),(unsigned_long_long)in_RDX,
            in_stack_ffffffffffffffec);
  cio_write((opj_cio_t *)CONCAT44(in_EDI,in_ESI),(unsigned_long_long)in_RDX,
            in_stack_ffffffffffffffec);
  cio_write((opj_cio_t *)CONCAT44(in_EDI,in_ESI),(unsigned_long_long)in_RDX,
            in_stack_ffffffffffffffec);
  cio_write((opj_cio_t *)CONCAT44(in_EDI,in_ESI),(unsigned_long_long)in_RDX,
            in_stack_ffffffffffffffec);
  cio_write((opj_cio_t *)CONCAT44(in_EDI,in_ESI),(unsigned_long_long)in_RDX,
            in_stack_ffffffffffffffec);
  iVar1 = cio_tell(in_RDX);
  iVar1 = iVar1 - pos;
  cio_seek(in_RDX,pos);
  cio_write((opj_cio_t *)CONCAT44(in_EDI,in_ESI),(unsigned_long_long)in_RDX,iVar1);
  cio_seek(in_RDX,pos + iVar1);
  return;
}

Assistant:

void write_cptr(int coff, int clen, opj_cio_t *cio)
{
  int len, lenp;

  lenp = cio_tell( cio);
  cio_skip( cio, 4);               /* L [at the end]     */
  cio_write( cio, JPIP_CPTR, 4);   /* T                  */
  cio_write( cio, 0, 2);           /* DR  A PRECISER !!  */
  cio_write( cio, 0, 2);           /* CONT               */
  cio_write( cio, coff, 8);    /* COFF A PRECISER !! */
  cio_write( cio, clen, 8);    /* CLEN               */
  len = cio_tell( cio) - lenp;
  cio_seek( cio, lenp);
  cio_write( cio, len, 4);         /* L                  */
  cio_seek( cio, lenp+len);
}